

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O0

FiniteAutomaton *
Omega_h::FiniteAutomaton::make_set_nfa
          (FiniteAutomaton *__return_storage_ptr__,int nsymbols,
          set<int,_std::less<int>,_std::allocator<int>_> *accepted,int token)

{
  bool bVar1;
  int from_state;
  int to_state;
  reference piVar2;
  iterator iStack_58;
  int i;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  int accept_state;
  int start_state;
  int token_local;
  set<int,_std::less<int>,_std::allocator<int>_> *accepted_local;
  int nsymbols_local;
  FiniteAutomaton *out;
  
  FiniteAutomaton(__return_storage_ptr__,nsymbols,true,2);
  from_state = add_state(__return_storage_ptr__);
  to_state = add_state(__return_storage_ptr__);
  __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(accepted);
  iStack_58 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(accepted);
  while (bVar1 = std::operator!=(&__end1,&stack0xffffffffffffffa8), bVar1) {
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    add_transition(__return_storage_ptr__,from_state,*piVar2,to_state);
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  add_accept(__return_storage_ptr__,to_state,token);
  return __return_storage_ptr__;
}

Assistant:

FiniteAutomaton FiniteAutomaton::make_set_nfa(
    int nsymbols, std::set<int> const& accepted, int token) {
  FiniteAutomaton out(nsymbols, true, 2);
  auto start_state = add_state(out);
  auto accept_state = add_state(out);
  for (auto i : accepted) {
    add_transition(out, start_state, i, accept_state);
  }
  add_accept(out, accept_state, token);
  return out;
}